

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTPNListBase::remove_element(CTPNListBase *this,CTcConstVal *val)

{
  int iVar1;
  CTcPrsNode *pCVar2;
  CTPNListEle *pCVar3;
  CTPNListEleBase *pCVar4;
  long in_RDI;
  CTPNListEle *cur;
  CTcConstVal *in_stack_000000c0;
  CTcConstVal *in_stack_000000c8;
  CTPNListEleBase *local_18;
  
  for (local_18 = *(CTPNListEleBase **)(in_RDI + 0x10); local_18 != (CTPNListEleBase *)0x0;
      local_18 = &CTPNListEleBase::get_next(local_18)->super_CTPNListEleBase) {
    CTPNListEleBase::get_expr(local_18);
    iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x25469f);
    if (iVar1 != 0) {
      pCVar2 = CTPNListEleBase::get_expr(local_18);
      (*(pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
      iVar1 = CTcConstVal::is_equal_to(in_stack_000000c8,in_stack_000000c0);
      if (iVar1 != 0) {
        pCVar3 = CTPNListEleBase::get_prev(local_18);
        if (pCVar3 == (CTPNListEle *)0x0) {
          pCVar3 = CTPNListEleBase::get_next(local_18);
          *(CTPNListEle **)(in_RDI + 0x10) = pCVar3;
        }
        else {
          pCVar4 = &CTPNListEleBase::get_prev(local_18)->super_CTPNListEleBase;
          pCVar3 = CTPNListEleBase::get_next(local_18);
          CTPNListEleBase::set_next(pCVar4,pCVar3);
        }
        pCVar3 = CTPNListEleBase::get_next(local_18);
        if (pCVar3 == (CTPNListEle *)0x0) {
          pCVar3 = CTPNListEleBase::get_prev(local_18);
          *(CTPNListEle **)(in_RDI + 0x18) = pCVar3;
        }
        else {
          pCVar4 = &CTPNListEleBase::get_next(local_18)->super_CTPNListEleBase;
          pCVar3 = CTPNListEleBase::get_prev(local_18);
          CTPNListEleBase::set_prev(pCVar4,pCVar3);
        }
        *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + -1;
      }
    }
  }
  return;
}

Assistant:

void CTPNListBase::remove_element(const CTcConstVal *val)
{
    CTPNListEle *cur;
    
    /* scan the list */
    for (cur = head_ ; cur != 0 ; cur = cur->get_next())
    {
        /* 
         *   if this element is constant, compare it to the value to be
         *   removed; if it matches, remove it 
         */
        if (cur->get_expr()->is_const()
            && cur->get_expr()->get_const_val()->is_equal_to(val))
        {
            /* set the previous element's forward pointer */
            if (cur->get_prev() == 0)
                head_ = cur->get_next();
            else
                cur->get_prev()->set_next(cur->get_next());

            /* set the next element's back pointer */
            if (cur->get_next() == 0)
                tail_ = cur->get_prev();
            else
                cur->get_next()->set_prev(cur->get_prev());

            /* decrement our element counter */
            --cnt_;
        }
    }
}